

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_integer_add(sysbvm_context_t *context,sysbvm_tuple_t left,sysbvm_tuple_t right)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t resultWordCount_00;
  uint32_t uVar3;
  int iVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_object_tuple_t *psVar6;
  size_t resultWordCount_1;
  size_t resultWordCount_01;
  size_t resultWordCount;
  sysbvm_decoded_integer_t decodedRightInteger;
  sysbvm_decoded_integer_t decodedLeftInteger;
  
  if ((right & 0xf) != 0 && (left & 0xf) != 0) {
    sVar5 = sysbvm_tuple_integer_encodeInt64(context,((long)right >> 4) + ((long)left >> 4));
    return sVar5;
  }
  decodedLeftInteger.words = (uint32_t *)0x0;
  decodedLeftInteger.inlineWordBuffer[0] = 0;
  decodedLeftInteger.inlineWordBuffer[1] = 0;
  decodedLeftInteger.isNegative = false;
  decodedLeftInteger._1_7_ = 0;
  decodedLeftInteger.wordCount = 0;
  decodedRightInteger.words = (uint32_t *)0x0;
  decodedRightInteger.inlineWordBuffer[0] = 0;
  decodedRightInteger.inlineWordBuffer[1] = 0;
  decodedRightInteger.isNegative = false;
  decodedRightInteger._1_7_ = 0;
  decodedRightInteger.wordCount = 0;
  sysbvm_integer_decodeLargeOrImmediate(context,&decodedLeftInteger,left);
  sysbvm_integer_decodeLargeOrImmediate(context,&decodedRightInteger,right);
  resultWordCount_00 = decodedLeftInteger.wordCount;
  uVar2 = decodedLeftInteger._0_8_;
  resultWordCount_01 = decodedRightInteger.wordCount;
  uVar1 = decodedRightInteger._0_8_;
  if (decodedLeftInteger.isNegative == decodedRightInteger.isNegative) {
    uVar3 = sysbvm_integer_sumInto
                      (decodedLeftInteger.wordCount,decodedLeftInteger.words,
                       decodedRightInteger.wordCount,decodedRightInteger.words,0,(uint32_t *)0x0);
    if (resultWordCount_01 < resultWordCount_00) {
      resultWordCount_01 = resultWordCount_00;
    }
    psVar6 = sysbvm_context_allocateByteTuple
                       (context,(&(context->roots).largePositiveIntegerType)[uVar2 & 0xff],
                        (uVar3 + resultWordCount_01) * 4);
    sysbvm_integer_sumInto
              (decodedLeftInteger.wordCount,decodedLeftInteger.words,decodedRightInteger.wordCount,
               decodedRightInteger.words,uVar3 + resultWordCount_01,
               (uint32_t *)(psVar6->field_1).pointers);
  }
  else {
    iVar4 = sysbvm_integer_compareMagnitudes
                      (decodedLeftInteger.wordCount,decodedLeftInteger.words,
                       decodedRightInteger.wordCount,decodedRightInteger.words);
    if (iVar4 == 0) {
      psVar6 = (sysbvm_object_tuple_t *)0x1;
    }
    else {
      if (iVar4 < 1) {
        psVar6 = sysbvm_context_allocateByteTuple
                           (context,(&(context->roots).largePositiveIntegerType)[uVar1 & 0xff],
                            resultWordCount_01 * 4);
        sysbvm_integer_subtractFromInto
                  (decodedRightInteger.wordCount,decodedRightInteger.words,
                   decodedLeftInteger.wordCount,decodedLeftInteger.words,resultWordCount_01,
                   (uint32_t *)(psVar6->field_1).pointers);
      }
      else {
        psVar6 = sysbvm_context_allocateByteTuple
                           (context,(&(context->roots).largePositiveIntegerType)[uVar2 & 0xff],
                            resultWordCount_00 * 4);
        sysbvm_integer_subtractFromInto
                  (decodedLeftInteger.wordCount,decodedLeftInteger.words,
                   decodedRightInteger.wordCount,decodedRightInteger.words,resultWordCount_00,
                   (uint32_t *)(psVar6->field_1).pointers);
      }
      psVar6 = (sysbvm_object_tuple_t *)sysbvm_integer_normalize(context,(sysbvm_integer_t *)psVar6)
      ;
    }
  }
  return (sysbvm_tuple_t)psVar6;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_integer_add(sysbvm_context_t *context, sysbvm_tuple_t left, sysbvm_tuple_t right)
{
    if(sysbvm_tuple_isImmediate(left) && sysbvm_tuple_isImmediate(right))
    {
        sysbvm_stuple_t leftValue = sysbvm_tuple_integer_decodeSmall(left);
        sysbvm_stuple_t rightValue = sysbvm_tuple_integer_decodeSmall(right);
        return sysbvm_tuple_integer_encodeInt64(context, leftValue + rightValue);
    }

    sysbvm_decoded_integer_t decodedLeftInteger = {0};
    sysbvm_decoded_integer_t decodedRightInteger = {0};
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedLeftInteger, left);
    sysbvm_integer_decodeLargeOrImmediate(context, &decodedRightInteger, right);

    if(decodedLeftInteger.isNegative == decodedRightInteger.isNegative)
    {
        // Same sign, sum
        uint32_t carry = sysbvm_integer_sumInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, 0, NULL);
        size_t resultWordCount = (decodedLeftInteger.wordCount > decodedRightInteger.wordCount) ? decodedLeftInteger.wordCount : decodedRightInteger.wordCount;
        if(carry != 0)
            ++resultWordCount;

        sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, decodedLeftInteger.isNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
        sysbvm_integer_sumInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
        return (sysbvm_tuple_t)result;
    }
    else
    {
        // Different sign, subtract.
        int magnitudeComparison = sysbvm_integer_compareMagnitudes(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words);
        if(magnitudeComparison == 0)
            return sysbvm_tuple_integer_encodeSmall(0);

        if(magnitudeComparison > 0)
        {
            size_t resultWordCount = decodedLeftInteger.wordCount;
            bool resultIsNegative = decodedLeftInteger.isNegative;
            sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
            sysbvm_integer_subtractFromInto(decodedLeftInteger.wordCount, decodedLeftInteger.words, decodedRightInteger.wordCount, decodedRightInteger.words, resultWordCount, result->words);
            return sysbvm_integer_normalize(context, result);
        }
        else
        {
            size_t resultWordCount = decodedRightInteger.wordCount;
            bool resultIsNegative = decodedRightInteger.isNegative;
            sysbvm_integer_t *result = (sysbvm_integer_t*)sysbvm_context_allocateByteTuple(context, resultIsNegative ? context->roots.largeNegativeIntegerType : context->roots.largePositiveIntegerType, resultWordCount*4);
            sysbvm_integer_subtractFromInto(decodedRightInteger.wordCount, decodedRightInteger.words, decodedLeftInteger.wordCount, decodedLeftInteger.words, resultWordCount, result->words);
            return sysbvm_integer_normalize(context, result);
        }
    }
}